

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O2

bool __thiscall
tchecker::algorithms::couvscc::
single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::accepting
          (single_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t> *this
          ,node_sptr_t *n,zg_t *ts,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels)

{
  bool bVar1;
  make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>
  *pmVar2;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
  local_40;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::none(labels);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    pmVar2 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
             ::operator->(n);
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
    ::intrusive_shared_ptr_t
              (&local_40,
               &(pmVar2->
                super_node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>
                ).super_node_t.super_node_zg_state_t._state);
    zg::zg_t::labels(&local_38,ts,&local_40);
    bVar1 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::is_subset_of
                      (labels,&local_38);
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_38)
    ;
    intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
    ::~intrusive_shared_ptr_t(&local_40);
  }
  return bVar1;
}

Assistant:

bool accepting(node_sptr_t & n, TS & ts, boost::dynamic_bitset<> const & labels) const
  {
    return !labels.none() && labels.is_subset_of(ts.labels(n->state_ptr()));
  }